

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_mul_v_parity_uint64_192_30(mzd_local_t *c,mzd_local_t *v,mzd_local_t *At)

{
  ulong *puVar1;
  uint64_t uVar2;
  long in_RDX;
  ulong *in_RSI;
  long in_RDI;
  uint j;
  word parity;
  block_t *Ablock;
  uint i;
  word res;
  block_t *vblock;
  block_t *cblock;
  uint local_4c;
  int local_34;
  ulong local_30;
  
  local_30 = 0;
  for (local_34 = 0x1e; local_34 != 0; local_34 = local_34 + -1) {
    puVar1 = (ulong *)(in_RDX + (ulong)(0x1e - local_34) * 0x20);
    uVar2 = parity64_uint64(*in_RSI & *puVar1 ^ in_RSI[1] & puVar1[1] ^ in_RSI[2] & puVar1[2]);
    local_30 = uVar2 << (0x40U - (char)local_34 & 0x3f) | local_30;
  }
  for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
    *(undefined8 *)(in_RDI + (ulong)local_4c * 8) = 0;
  }
  *(ulong *)(in_RDI + 0x10) = local_30;
  return;
}

Assistant:

void mzd_mul_v_parity_uint64_192_30(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* At) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* vblock = CONST_BLOCK(v, 0);

  word res = 0;
  for (unsigned int i = 30; i; --i) {
    const block_t* Ablock = CONST_BLOCK(At, 30 - i);
    const word parity =
        parity64_uint64((vblock->w64[0] & Ablock->w64[0]) ^ (vblock->w64[1] & Ablock->w64[1]) ^
                        (vblock->w64[2] & Ablock->w64[2]));
    res |= parity << (64 - i);
  }
  for (unsigned int j = 0; j < 2; j++) {
    cblock->w64[j] = 0;
  }
  cblock->w64[2] = res;
}